

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

bool __thiscall
Shell::Options::RatioOptionValue::readRatio(RatioOptionValue *this,char *val,char separator)

{
  bool bVar1;
  size_t sVar2;
  char in_DL;
  char *in_RSI;
  int *in_RDI;
  int weight;
  int weight_1;
  int age;
  char copy [128];
  int colonIndex;
  bool found;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int local_b0;
  int local_ac;
  char local_a8 [136];
  int local_20;
  char local_1a;
  char *local_18;
  bool local_1;
  
  local_1a = '\0';
  local_20 = 0;
  do {
    if (in_RSI[local_20] == '\0') {
LAB_00c36263:
      if (local_1a == '\0') {
        in_RDI[0x26] = 1;
        bVar1 = Lib::Int::stringToInt
                          ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                           in_RDI);
        if (bVar1) {
          in_RDI[0x3a] = in_stack_ffffffffffffff4c;
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_18 = in_RSI;
        sVar2 = strlen(in_RSI);
        if (sVar2 < 0x80) {
          strncpy(local_a8,local_18,0x7f);
          local_a8[local_20] = '\0';
          bVar1 = Lib::Int::stringToInt
                            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                             in_RDI);
          if (bVar1) {
            in_RDI[0x26] = local_ac;
            bVar1 = Lib::Int::stringToInt
                              ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                               ,in_RDI);
            if (bVar1) {
              in_RDI[0x3a] = local_b0;
              if ((in_RDI[0x26] == 0) && (in_RDI[0x3a] == 0)) {
                local_1 = false;
              }
              else {
                local_1 = true;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      return local_1;
    }
    if (in_RSI[local_20] == in_DL) {
      local_1a = '\x01';
      goto LAB_00c36263;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool Options::RatioOptionValue::readRatio(const char* val, char separator)
{
  // search the string for ":"
  bool found = false;
  int colonIndex = 0;
  while (val[colonIndex]) {
    if (val[colonIndex] == separator) {
      found = true;
      break;
    }
    colonIndex++;
  }

  if (found) {
    if (strlen(val) >= COPY_SIZE) {
      return false;
    }
    char copy[COPY_SIZE];
    strncpy(copy,val,COPY_SIZE - 1); // leave space for trailing NUL
    copy[colonIndex] = 0;
    int age;
    if (! Int::stringToInt(copy,age)) {
      return false;
    }
    actualValue = age;
    int weight;
    if (! Int::stringToInt(copy+colonIndex+1,weight)) {
      return false;
    }
    otherValue = weight;

    // don't allow ratios 0:0
    if (actualValue == 0 && otherValue == 0) {
      return false;
    }

    return true;
  }
  actualValue = 1;
  int weight;
  if (! Int::stringToInt(val,weight)) {
    return false;
  }
  otherValue = weight;
  return true;
}